

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

sat_solver * Ifn_ManStrFindSolver(Gia_Man_t *p,Vec_Int_t **pvPiVars,Vec_Int_t **pvPoVars)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  
  pAig = Gia_ManToAigSimple(p);
  pAig->nRegs = 0;
  p_00 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  s = sat_solver_new();
  sat_solver_setnvars(s,p_00->nVars);
  lVar6 = 0;
  while (lVar6 < p_00->nClauses) {
    iVar2 = sat_solver_addclause(s,p_00->pClauses[lVar6],p_00->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x260,
                    "sat_solver *Ifn_ManStrFindSolver(Gia_Man_t *, Vec_Int_t **, Vec_Int_t **)");
    }
  }
  pVVar4 = Vec_IntAlloc(p->vCis->nSize - p->nRegs);
  *pvPiVars = pVVar4;
  for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManCi(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pVVar4 = *pvPiVars;
    piVar1 = p_00->pVarNums;
    iVar3 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(pVVar4,piVar1[iVar3]);
  }
  pVVar4 = Vec_IntAlloc(p->vCos->nSize - p->nRegs);
  *pvPoVars = pVVar4;
  for (iVar2 = 0; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManCo(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pVVar4 = *pvPoVars;
    piVar1 = p_00->pVarNums;
    iVar3 = Gia_ObjId(p,pGVar5);
    Vec_IntPush(pVVar4,piVar1[iVar3]);
  }
  Cnf_DataFree(p_00);
  return s;
}

Assistant:

sat_solver * Ifn_ManStrFindSolver( Gia_Man_t * p, Vec_Int_t ** pvPiVars, Vec_Int_t ** pvPoVars )
{
    sat_solver * pSat;
    Gia_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int i;    
    pCnf = Cnf_DeriveGiaRemapped( p );
    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // inputs/outputs
    *pvPiVars = Vec_IntAlloc( Gia_ManPiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( *pvPiVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    *pvPoVars = Vec_IntAlloc( Gia_ManPoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntPush( *pvPoVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    Cnf_DataFree( pCnf );
    return pSat;
}